

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigCreateChoice(Ivy_Man_t *p,Ivy_Obj_t *pObjOld,Ivy_Obj_t *pObjNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *pObj;
  int fCompl;
  Ivy_Obj_t *pObjNewHaigR;
  Ivy_Obj_t *pObjOldHaigR;
  Ivy_Obj_t *pObjNewHaig;
  Ivy_Obj_t *pObjOldHaig;
  Ivy_Obj_t *pObjNew_local;
  Ivy_Obj_t *pObjOld_local;
  Ivy_Man_t *p_local;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,0xfd,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_IsComplement(pObjOld);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObjOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,0xfe,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  pIVar6 = pObjOld->pEquiv;
  pIVar4 = Ivy_Regular(pObjNew);
  pIVar4 = pIVar4->pEquiv;
  iVar1 = Ivy_IsComplement(pObjNew);
  pIVar4 = Ivy_NotCond(pIVar4,iVar1);
  pIVar5 = Ivy_Regular(pIVar6);
  pIVar5 = Ivy_HaigObjRepr(pIVar5);
  iVar1 = Ivy_IsComplement(pIVar6);
  pIVar6 = Ivy_NotCond(pIVar5,iVar1);
  pIVar5 = Ivy_Regular(pIVar4);
  pIVar5 = Ivy_HaigObjRepr(pIVar5);
  iVar1 = Ivy_IsComplement(pIVar4);
  pIVar4 = Ivy_NotCond(pIVar5,iVar1);
  pIVar5 = Ivy_Regular(pIVar6);
  pObj = Ivy_Regular(pIVar4);
  iVar1 = Ivy_IsComplement(pIVar6);
  iVar2 = Ivy_IsComplement(pIVar4);
  if (pIVar5 != pObj) {
    iVar3 = Ivy_ObjRefs(pIVar5);
    if (((iVar3 == 0) || (pObj->pEquiv != (Ivy_Obj_t *)0x0)) ||
       (iVar3 = Ivy_ObjRefs(pObj), 0 < iVar3)) {
      p->pHaig->nClassesSkip = p->pHaig->nClassesSkip + 1;
    }
    else {
      iVar3 = Ivy_ObjRefs(pIVar5);
      if (iVar3 < 1) {
        __assert_fail("Ivy_ObjRefs(pObjOldHaigR) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                      ,0x11d,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      iVar3 = Ivy_IsComplement(pIVar5->pEquiv);
      if (iVar3 != 0) {
        __assert_fail("!Ivy_IsComplement(pObjOldHaigR->pEquiv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                      ,0x11e,"void Ivy_ManHaigCreateChoice(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      if (pIVar5->pEquiv == (Ivy_Obj_t *)0x0) {
        pIVar6 = Ivy_NotCond(pIVar5,(uint)(iVar1 != iVar2));
        pObj->pEquiv = pIVar6;
      }
      else {
        pIVar6 = Ivy_NotCond(pIVar5->pEquiv,(uint)(iVar1 != iVar2));
        pObj->pEquiv = pIVar6;
      }
      pIVar5->pEquiv = pObj;
    }
  }
  return;
}

Assistant:

void Ivy_ManHaigCreateChoice( Ivy_Man_t * p, Ivy_Obj_t * pObjOld, Ivy_Obj_t * pObjNew )
{
    Ivy_Obj_t * pObjOldHaig, * pObjNewHaig;
    Ivy_Obj_t * pObjOldHaigR, * pObjNewHaigR;
    int fCompl;
//printf( "\nCreating choice for %d and %d in AIG\n", pObjOld->Id, Ivy_Regular(pObjNew)->Id );

    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObjOld) );
    // get pointers to the representatives of pObjOld and pObjNew
    pObjOldHaig = pObjOld->pEquiv;
    pObjNewHaig = Ivy_NotCond( Ivy_Regular(pObjNew)->pEquiv, Ivy_IsComplement(pObjNew) );
    // get the classes
    pObjOldHaig = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObjOldHaig)), Ivy_IsComplement(pObjOldHaig) );
    pObjNewHaig = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObjNewHaig)), Ivy_IsComplement(pObjNewHaig) );
    // get regular pointers
    pObjOldHaigR = Ivy_Regular(pObjOldHaig);
    pObjNewHaigR = Ivy_Regular(pObjNewHaig);
    // check if there is phase difference between them
    fCompl = (Ivy_IsComplement(pObjOldHaig) != Ivy_IsComplement(pObjNewHaig));
    // if the class is the same, nothing to do
    if ( pObjOldHaigR == pObjNewHaigR )
        return;
    // if the second node belongs to a class, do not merge classes (for the time being)
    if ( Ivy_ObjRefs(pObjOldHaigR) == 0 || pObjNewHaigR->pEquiv != NULL || 
        Ivy_ObjRefs(pObjNewHaigR) > 0 ) //|| Ivy_ObjIsInTfi_rec(pObjNewHaigR, pObjOldHaigR, 10) )
    {
/*
        if ( pObjNewHaigR->pEquiv != NULL )
            printf( "c" );
        if ( Ivy_ObjRefs(pObjNewHaigR) > 0 )
            printf( "f" );
        printf( " " );
*/
        p->pHaig->nClassesSkip++;
        return;
    }

    // add this node to the class of pObjOldHaig
    assert( Ivy_ObjRefs(pObjOldHaigR) > 0 );
    assert( !Ivy_IsComplement(pObjOldHaigR->pEquiv) );
    if ( pObjOldHaigR->pEquiv == NULL )
        pObjNewHaigR->pEquiv = Ivy_NotCond( pObjOldHaigR, fCompl );
    else
        pObjNewHaigR->pEquiv = Ivy_NotCond( pObjOldHaigR->pEquiv, fCompl );
    pObjOldHaigR->pEquiv = pObjNewHaigR;
//printf( "Setting choice node %d -> %d.\n", pObjOldHaigR->Id, pObjNewHaigR->Id );
    // update the class of the new node
//    Ivy_Regular(pObjNew)->pEquiv = Ivy_NotCond( pObjOldHaigR, fCompl ^ Ivy_IsComplement(pObjNew) );
//printf( "Creating choice for %d and %d in HAIG\n", pObjOldHaigR->Id, pObjNewHaigR->Id );

//    if ( pObjOldHaigR->Id == 13 )
//    {
//        Ivy_ManShow( p, 0 );
//        Ivy_ManShow( p->pHaig, 1 );
//    }
//    if ( !Ivy_ManIsAcyclic( p->pHaig ) )
//        printf( "HAIG contains a cycle\n" );
}